

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::mousePressEvent(AbstractScrollArea *this,QMouseEvent *e)

{
  MouseButton MVar1;
  QPoint __addr_len;
  AbstractScrollAreaPrivate *pAVar2;
  sockaddr *__addr;
  int __fd;
  QMouseEvent *e_local;
  AbstractScrollArea *this_local;
  
  __fd = (int)e;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)e);
  if (MVar1 == LeftButton) {
    __addr_len = QMouseEvent::pos(e);
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    pAVar2->mousePos = __addr_len;
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    pAVar2->leftMouseButtonPressed = true;
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation(pAVar2);
    QEvent::accept((QEvent *)e,__fd,__addr,(socklen_t *)__addr_len);
  }
  else {
    QEvent::ignore((QEvent *)e);
  }
  return;
}

Assistant:

void
AbstractScrollArea::mousePressEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		d->mousePos = e->pos();
		d->leftMouseButtonPressed = true;
		d->stopScrollIndicatorsAnimation();

		e->accept();
	}
	else
		e->ignore();
}